

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O3

cmd_ln_t * cmd_ln_parse_r(cmd_ln_t *inout_cmdln,arg_t *defn,int32 argc,char **argv,int strict)

{
  int iVar1;
  uint uVar2;
  int32 iVar3;
  cmd_ln_t *cmdln;
  arg_t *paVar4;
  hash_table_t *phVar5;
  cmd_ln_val_t *val;
  cmd_ln_val_t *pcVar6;
  FILE *pFVar7;
  char *fmt;
  arg_t *val_00;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  uint size;
  void *v;
  cmd_ln_val_t *local_40;
  hash_table_t *local_38;
  
  cmdln = inout_cmdln;
  if (inout_cmdln == (cmd_ln_t *)0x0) {
    cmdln = (cmd_ln_t *)
            __ckd_calloc__(1,0x20,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                           ,0x234);
    cmdln->refcount = 1;
  }
  local_38 = hash_table_new(0x32,0);
  size = 0;
  if ((defn != (arg_t *)0x0) && (pcVar9 = defn->name, size = 0, pcVar9 != (char *)0x0)) {
    size = 0;
    val_00 = defn;
    do {
      paVar4 = (arg_t *)hash_table_enter(local_38,pcVar9,val_00);
      if ((strict != 0) && (val_00 != paVar4)) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                ,0x242,"Duplicate argument name in definition: %s\n",val_00->name);
        goto LAB_0010843e;
      }
      pcVar9 = val_00[1].name;
      val_00 = val_00 + 1;
      size = size + 1;
    } while (pcVar9 != (char *)0x0);
  }
  if (cmdln->ht == (hash_table_t *)0x0) {
    phVar5 = hash_table_new(size,0);
    cmdln->ht = phVar5;
  }
  if (argc < 1) {
    uVar2 = 0;
  }
  else {
    uVar2 = (uint)(**argv != '-');
  }
  if ((int)uVar2 < argc) {
    uVar10 = (ulong)uVar2;
    do {
      iVar3 = hash_table_lookup(local_38,argv[uVar10],&local_40);
      pcVar6 = local_40;
      iVar1 = (int)uVar10;
      if (iVar3 < 0) {
        if (strict != 0) {
          pcVar9 = argv[uVar10];
          fmt = "Unknown argument name \'%s\'\n";
          lVar8 = 0x25f;
LAB_00108428:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                  ,lVar8,fmt,pcVar9);
          goto LAB_0010843e;
        }
        if (defn == (arg_t *)0x0) {
          local_40 = (cmd_ln_val_t *)0x0;
          if (iVar1 + 1 < argc) goto LAB_0010812d;
          goto LAB_0010833e;
        }
      }
      else {
        if (argc <= iVar1 + 1) {
LAB_0010833e:
          cmd_ln_print_help_r(cmdln,_stderr,defn);
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                  ,0x26c,"Argument value for \'%s\' missing\n",argv[uVar10]);
          goto LAB_0010843e;
        }
        if (local_40 == (cmd_ln_val_t *)0x0) {
LAB_0010812d:
          val = cmd_ln_val_init(8,argv[uVar10],argv[iVar1 + 1]);
          pcVar6 = (cmd_ln_val_t *)0x0;
        }
        else {
          val = cmd_ln_val_init(local_40->type,argv[uVar10],argv[uVar10 + 1]);
          if (val == (cmd_ln_val_t *)0x0) {
            cmd_ln_print_help_r(cmdln,_stderr,defn);
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                    ,0x276,"Bad argument value for %s: %s\n",argv[uVar10],argv[uVar10 + 1]);
            goto LAB_0010843e;
          }
        }
        local_40 = (cmd_ln_val_t *)hash_table_enter(cmdln->ht,val->name,val);
        if (local_40 != val) {
          if (strict != 0) {
            cmd_ln_val_free(val);
            pcVar9 = (char *)(pcVar6->val).ptr;
            fmt = "Duplicate argument name in arguments: %s\n";
            lVar8 = 0x281;
            goto LAB_00108428;
          }
          local_40 = (cmd_ln_val_t *)hash_table_replace(cmdln->ht,val->name,val);
          cmd_ln_val_free(local_40);
        }
      }
      uVar10 = uVar10 + 2;
    } while ((int)uVar10 < argc);
  }
  if (size != 0) {
    lVar8 = 0;
    do {
      iVar3 = hash_table_lookup(cmdln->ht,*(char **)((long)&defn->name + lVar8),&local_40);
      if (iVar3 < 0) {
        pcVar6 = cmd_ln_val_init(*(int *)((long)&defn->type + lVar8),
                                 *(char **)((long)&defn->name + lVar8),
                                 *(char **)((long)&defn->deflt + lVar8));
        if (pcVar6 == (cmd_ln_val_t *)0x0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                  ,0x294,"Bad default argument value for %s: %s\n",
                  *(undefined8 *)((long)&defn->name + lVar8),
                  *(undefined8 *)((long)&defn->deflt + lVar8));
LAB_0010843e:
          if (local_38 != (hash_table_t *)0x0) {
            hash_table_free(local_38);
          }
          if (inout_cmdln == (cmd_ln_t *)0x0) {
            cmd_ln_free_r(cmdln);
          }
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                  ,0x2bf,"Failed to parse arguments list\n");
          return (cmd_ln_t *)0x0;
        }
        hash_table_enter(cmdln->ht,pcVar6->name,pcVar6);
      }
      lVar8 = lVar8 + 0x20;
    } while ((ulong)size << 5 != lVar8);
    if (size != 0) {
      lVar8 = 0;
      do {
        if (((*(byte *)((long)&defn->type + lVar8) & 1) != 0) &&
           (iVar3 = hash_table_lookup(cmdln->ht,*(char **)((long)&defn->name + lVar8),&local_40),
           iVar3 != 0)) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                  ,0x2a1,"Missing required argument %s\n",*(undefined8 *)((long)&defn->name + lVar8)
                 );
        }
        lVar8 = lVar8 + 0x20;
      } while ((ulong)size << 5 != lVar8);
    }
  }
  if (argc == 1 && strict != 0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
            ,0x2aa,"No arguments given, available options are:\n");
    cmd_ln_print_help_r(cmdln,_stderr,defn);
    if (local_38 != (hash_table_t *)0x0) {
      hash_table_free(local_38);
    }
    if (inout_cmdln == (cmd_ln_t *)0x0) {
      cmd_ln_free_r(cmdln);
    }
    cmdln = (cmd_ln_t *)0x0;
  }
  else {
    pFVar7 = err_get_logfp();
    if (pFVar7 != (FILE *)0x0) {
      pFVar7 = err_get_logfp();
      cmd_ln_print_values_r(cmdln,pFVar7,defn);
    }
    hash_table_free(local_38);
  }
  return cmdln;
}

Assistant:

cmd_ln_t *
cmd_ln_parse_r(cmd_ln_t *inout_cmdln, const arg_t * defn, int32 argc, char *argv[], int strict)
{
    int32 i, j, n, argstart;
    hash_table_t *defidx = NULL;
    cmd_ln_t *cmdln;

    /* Construct command-line object */
    if (inout_cmdln == NULL) {
        cmdln = (cmd_ln_t*)ckd_calloc(1, sizeof(*cmdln));
        cmdln->refcount = 1;
    }
    else
        cmdln = inout_cmdln;

    /* Build a hash table for argument definitions */
    defidx = hash_table_new(50, 0);
    if (defn) {
        for (n = 0; defn[n].name; n++) {
            void *v;

            v = hash_table_enter(defidx, defn[n].name, (void *)&defn[n]);
            if (strict && (v != &defn[n])) {
                E_ERROR("Duplicate argument name in definition: %s\n", defn[n].name);
                goto error;
            }
        }
    }
    else {
        /* No definitions. */
        n = 0;
    }

    /* Allocate memory for argument values */
    if (cmdln->ht == NULL)
        cmdln->ht = hash_table_new(n, 0 /* argument names are case-sensitive */ );


    /* skip argv[0] if it doesn't start with dash */
    argstart = 0;
    if (argc > 0 && argv[0][0] != '-') {
        argstart = 1;
    }

    /* Parse command line arguments (name-value pairs) */
    for (j = argstart; j < argc; j += 2) {
        arg_t *argdef;
        cmd_ln_val_t *val;
        void *v;

        if (hash_table_lookup(defidx, argv[j], &v) < 0) {
            if (strict) {
                E_ERROR("Unknown argument name '%s'\n", argv[j]);
                goto error;
            }
            else if (defn == NULL)
                v = NULL;
            else
                continue;
        }
        argdef = (arg_t *)v;

        /* Enter argument value */
        if (j + 1 >= argc) {
            cmd_ln_print_help_r(cmdln, stderr, defn);
            E_ERROR("Argument value for '%s' missing\n", argv[j]);
            goto error;
        }

        if (argdef == NULL)
            val = cmd_ln_val_init(ARG_STRING, argv[j], argv[j + 1]);
        else {
            if ((val = cmd_ln_val_init(argdef->type, argv[j], argv[j + 1])) == NULL) {
                cmd_ln_print_help_r(cmdln, stderr, defn);
                E_ERROR("Bad argument value for %s: %s\n", argv[j],
                        argv[j + 1]);
                goto error;
            }
        }

        if ((v = hash_table_enter(cmdln->ht, val->name, (void *)val)) !=
            (void *)val)
        {
            if (strict) {
                cmd_ln_val_free(val);
                E_ERROR("Duplicate argument name in arguments: %s\n",
                        argdef->name);
                goto error;
            }
            else {
                v = hash_table_replace(cmdln->ht, val->name, (void *)val);
                cmd_ln_val_free((cmd_ln_val_t *)v);
            }
        }
    }

    /* Fill in default values, if any, for unspecified arguments */
    for (i = 0; i < n; i++) {
        cmd_ln_val_t *val;
        void *v;

        if (hash_table_lookup(cmdln->ht, defn[i].name, &v) < 0) {
            if ((val = cmd_ln_val_init(defn[i].type, defn[i].name, defn[i].deflt)) == NULL) {
                E_ERROR
                    ("Bad default argument value for %s: %s\n",
                     defn[i].name, defn[i].deflt);
                goto error;
            }
            hash_table_enter(cmdln->ht, val->name, (void *)val);
        }
    }

    /* Check for required arguments; exit if any missing */
    j = 0;
    for (i = 0; i < n; i++) {
        if (defn[i].type & ARG_REQUIRED) {
            void *v;
            if (hash_table_lookup(cmdln->ht, defn[i].name, &v) != 0)
                E_ERROR("Missing required argument %s\n", defn[i].name);
        }
    }
    if (j > 0) {
        cmd_ln_print_help_r(cmdln, stderr, defn);
        goto error;
    }

    if (strict && argc == 1) {
        E_ERROR("No arguments given, available options are:\n");
        cmd_ln_print_help_r(cmdln, stderr, defn);
        if (defidx)
            hash_table_free(defidx);
        if (inout_cmdln == NULL)
            cmd_ln_free_r(cmdln);
        return NULL;
    }

    /* Print current values always in SphinxTrain */
    if (err_get_logfp())
	cmd_ln_print_values_r(cmdln, err_get_logfp(), defn);

    hash_table_free(defidx);
    return cmdln;

  error:
    if (defidx)
        hash_table_free(defidx);
    if (inout_cmdln == NULL)
        cmd_ln_free_r(cmdln);
    E_ERROR("Failed to parse arguments list\n");
    return NULL;
}